

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
          (spvtools *this,IRContext **args,Op *args_1,uint *args_2,uint *args_3,
          initializer_list<spvtools::opt::Operand> *args_4)

{
  Op op;
  uint32_t ty_id;
  uint32_t res_id;
  IRContext *c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  Instruction *this_00;
  allocator_type local_51;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_50._M_head_impl = (Instruction *)this;
  this_00 = (Instruction *)::operator_new(0x70);
  c = *args;
  op = *args_1;
  ty_id = *args_2;
  res_id = *args_3;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_48,*args_4,&local_51);
  opt::Instruction::Instruction(this_00,c,op,ty_id,res_id,&local_48);
  _Var1._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}